

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atoi.h
# Opt level: O2

unsigned_long jsteemann::atoi_positive<unsigned_long>(char *p,char *e,bool *valid)

{
  unsigned_long uVar1;
  bool bVar2;
  byte bVar3;
  
  if (p == e) {
    bVar2 = false;
    uVar1 = 0;
  }
  else {
    uVar1 = 0;
    do {
      if ((byte)(*p - 0x3aU) < 0xf6) {
LAB_00129253:
        bVar2 = false;
        goto LAB_00129250;
      }
      bVar3 = *p - 0x30;
      if ((0x1999999999999999 < uVar1) || (uVar1 == 0x1999999999999999 && 5 < bVar3))
      goto LAB_00129253;
      uVar1 = (ulong)bVar3 + uVar1 * 10;
      p = p + 1;
    } while (p < e);
    bVar2 = true;
  }
LAB_00129250:
  *valid = bVar2;
  return uVar1;
}

Assistant:

inline T atoi_positive(char const* p, char const* e, bool& valid) noexcept {
  if (ATOI_UNLIKELY(p == e)) {
    valid = false;
    return T();
  }

  constexpr T cutoff = (std::numeric_limits<T>::max)() / 10;
  constexpr char cutlim = (std::numeric_limits<T>::max)() % 10;
  T result = 0;

  do {
    char c = *p;

    // we expect only '0' to '9'. everything else is unexpected
    if (ATOI_UNLIKELY(c < '0' || c > '9')) {
      valid = false;
      return result;
    }

    c -= '0';
    // we expect the bulk of values to not hit the bounds restrictions
    if (ATOI_UNLIKELY(result > cutoff || (result == cutoff && c > cutlim))) {
      valid = false;
      return result;
    } 
    result *= 10;
    result += c;
  } while (++p < e);

  valid = true;
  return result;
}